

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::BuildMaterials(ColladaLoader *this,ColladaParser *pParser,aiScene *param_2)

{
  bool bVar1;
  size_type __n;
  pointer ppVar2;
  pointer ppVar3;
  aiMaterial *this_00;
  ulong uVar4;
  size_type sVar5;
  mapped_type_conflict3 *pmVar6;
  pointer local_4b0;
  Effect *local_490;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> local_488;
  undefined1 local_478 [8];
  aiString name;
  aiMaterial *local_68;
  aiMaterial *mat;
  Effect *effect;
  _Self local_50;
  iterator effIt;
  Material *material;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
  local_28;
  const_iterator matIt;
  aiScene *param_2_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  matIt._M_node = (_Base_ptr)param_2;
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
        ::size(&pParser->mMaterialLibrary);
  std::
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::reserve(&this->newMats,__n);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
       ::begin(&pParser->mMaterialLibrary);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  while( true ) {
    material = (Material *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
               ::end(&pParser->mMaterialLibrary);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
    ::_Rb_tree_const_iterator(&local_38,(iterator *)&material);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
             ::operator->(&local_28);
    effIt._M_node = (_Base_ptr)&ppVar2->second;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
         ::find(&pParser->mEffectLibrary,&(ppVar2->second).mEffect);
    effect = (Effect *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
             ::end(&pParser->mEffectLibrary);
    bVar1 = std::operator==(&local_50,(_Self *)&effect);
    if (!bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>
               ::operator->(&local_50);
      mat = (aiMaterial *)&ppVar3->second;
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      local_68 = this_00;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_4b0 = (pointer)effIt._M_node;
      }
      else {
        local_4b0 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
                    ::operator->(&local_28);
      }
      aiString::aiString((aiString *)local_478,&local_4b0->first);
      aiMaterial::AddProperty(local_68,(aiString *)local_478,"?mat.name",0,0);
      sVar5 = std::
              vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
              ::size(&this->newMats);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
               ::operator->(&local_28);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->mMaterialIndexByName,&ppVar2->first);
      *pmVar6 = sVar5;
      local_490 = (Effect *)mat;
      std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>::
      pair<Assimp::Collada::Effect_*,_aiMaterial_*&,_true>(&local_488,&local_490,&local_68);
      std::
      vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
      ::push_back(&this->newMats,&local_488);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void ColladaLoader::BuildMaterials(ColladaParser& pParser, aiScene* /*pScene*/)
{
    newMats.reserve(pParser.mMaterialLibrary.size());

    for (ColladaParser::MaterialLibrary::const_iterator matIt = pParser.mMaterialLibrary.begin();
        matIt != pParser.mMaterialLibrary.end(); ++matIt) {
        const Collada::Material& material = matIt->second;
        // a material is only a reference to an effect
        ColladaParser::EffectLibrary::iterator effIt = pParser.mEffectLibrary.find(material.mEffect);
        if (effIt == pParser.mEffectLibrary.end())
            continue;
        Collada::Effect& effect = effIt->second;

        // create material
        aiMaterial* mat = new aiMaterial;
        aiString name(material.mName.empty() ? matIt->first : material.mName);
        mat->AddProperty(&name, AI_MATKEY_NAME);

        // store the material
        mMaterialIndexByName[matIt->first] = newMats.size();
        newMats.push_back(std::pair<Collada::Effect*, aiMaterial*>(&effect, mat));
    }
    // ScenePreprocessor generates a default material automatically if none is there.
    // All further code here in this loader works well without a valid material so
    // we can safely let it to ScenePreprocessor.
#if 0
    if (newMats.size() == 0)
    {
        aiMaterial* mat = new aiMaterial;
        aiString name(AI_DEFAULT_MATERIAL_NAME);
        mat->AddProperty(&name, AI_MATKEY_NAME);

        const int shadeMode = aiShadingMode_Phong;
        mat->AddProperty<int>(&shadeMode, 1, AI_MATKEY_SHADING_MODEL);
        aiColor4D colAmbient(0.2, 0.2, 0.2, 1.0), colDiffuse(0.8, 0.8, 0.8, 1.0), colSpecular(0.5, 0.5, 0.5, 0.5);
        mat->AddProperty(&colAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
        mat->AddProperty(&colDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat->AddProperty(&colSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        const ai_real specExp = 5.0;
        mat->AddProperty(&specExp, 1, AI_MATKEY_SHININESS);
}
#endif
}